

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BvhNode.cpp
# Opt level: O1

void __thiscall
BVH_Node::BVH_Node(BVH_Node *this,Object **list,int size,float t_start,float t_end,bool is_root)

{
  int iVar1;
  long lVar2;
  BVH_Node *pBVar3;
  bool bVar4;
  AABB _aabb_right;
  AABB _aabb_left;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  AABB local_58;
  AABB local_40;
  
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__BVH_Node_00121a08;
  this->m_is_root = is_root;
  if (size == 2) {
    this->m_node_left = *list;
    pBVar3 = (BVH_Node *)list[1];
    bVar4 = true;
    lVar2 = 0x28;
  }
  else if (size == 1) {
    pBVar3 = (BVH_Node *)*list;
    this->m_node_right = (Object *)pBVar3;
    bVar4 = true;
    lVar2 = 0x20;
  }
  else {
    iVar1 = size / 2;
    pBVar3 = (BVH_Node *)operator_new(0x38);
    BVH_Node(pBVar3,list,iVar1,t_start,t_end,false);
    this->m_node_left = (Object *)pBVar3;
    pBVar3 = (BVH_Node *)operator_new(0x38);
    bVar4 = false;
    BVH_Node(pBVar3,list + iVar1,size - iVar1,t_start,t_end,false);
    lVar2 = 0x28;
  }
  *(BVH_Node **)((long)(this->m_aabb).m_min.e + lVar2 + -8) = pBVar3;
  this->m_is_leaf = bVar4;
  iVar1 = (*this->m_node_left->_vptr_Object[3])(t_start,t_end,this->m_node_left,&local_40);
  if ((char)iVar1 != '\0') {
    iVar1 = (*this->m_node_right->_vptr_Object[3])(t_start,t_end,this->m_node_right,&local_58);
    if ((char)iVar1 != '\0') goto LAB_00106e42;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Bounding Box Creation Error\n",0x1c);
LAB_00106e42:
  AABB::Merge(&local_40,&local_58);
  *(undefined8 *)((this->m_aabb).m_max.e + 1) = local_60;
  *(undefined8 *)(this->m_aabb).m_min.e = local_70;
  *(undefined8 *)((this->m_aabb).m_min.e + 2) = uStack_68;
  return;
}

Assistant:

BVH_Node::BVH_Node(Object **list, int size, float t_start, float t_end, bool is_root)
{
    m_is_root = is_root;

    if(size == 1) {
        m_node_left = m_node_right = list[0];
        m_is_leaf   = true;
    } 
    else if(size == 2) {
        m_node_left  = list[0];
        m_node_right = list[1];
        m_is_leaf    = true;
    }
    else {
        int _div_size_2 = size/2;
        m_node_left  = new BVH_Node(list              ,        _div_size_2, t_start, t_end);
        m_node_right = new BVH_Node(list + _div_size_2, size - _div_size_2, t_start, t_end);
        m_is_leaf    = false;
    }

    AABB _aabb_left, _aabb_right;
    if(!m_node_left->CreateBoundingBox (t_start, t_end, _aabb_left ) ||
       !m_node_right->CreateBoundingBox(t_start, t_end, _aabb_right)) {
           std::cerr << "Bounding Box Creation Error\n";
    }

    m_aabb = AABB::Merge(_aabb_left, _aabb_right);
}